

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

size_t encoder_qp_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  byte bVar1;
  byte bVar2;
  undefined4 uVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  size_t n;
  ulong uVar7;
  bool bVar8;
  char buf [4];
  undefined8 uStack_50;
  undefined4 local_48;
  uint local_44;
  size_t local_40;
  mime_encoder_state *local_38;
  
  uVar7 = (part->encstate).bufbeg;
  if (uVar7 < (part->encstate).bufend) {
    local_38 = &part->encstate;
    local_44 = (uint)ateof;
    local_40 = 0;
    do {
      uVar3 = local_48;
      bVar1 = (part->encstate).buf[uVar7];
      bVar2 = ""[bVar1];
      n = (size_t)bVar2;
      local_48._0_2_ = CONCAT11("0123456789ABCDEF"[bVar1 >> 4],bVar1);
      local_48._3_1_ = SUB41(uVar3,3);
      local_48._0_3_ = CONCAT12("0123456789ABCDEF"[bVar1 & 0xf],(undefined2)local_48);
      uVar7 = n;
      if (bVar2 != 1) {
        if (bVar2 == 3) {
          uStack_50 = 0x4e562e;
          iVar4 = qp_lookahead_eol(local_38,local_44,0);
          if (iVar4 != 1) {
            if (iVar4 == -1) {
              return local_40;
            }
            goto LAB_004e563c;
          }
          local_48._0_2_ = CONCAT11(10,(undefined1)local_48);
          n = 2;
          uVar7 = 2;
        }
        else {
          if (bVar2 == 2) {
            n = 1;
            uStack_50 = 0x4e560b;
            iVar4 = qp_lookahead_eol(local_38,local_44,1);
            if (iVar4 == 0) {
              uVar7 = 1;
              goto LAB_004e566a;
            }
            if (iVar4 == -1) {
              return local_40;
            }
          }
          else {
LAB_004e563c:
          }
          local_48 = CONCAT31(local_48._1_3_,0x3d);
          n = 1;
          uVar7 = 3;
        }
      }
LAB_004e566a:
      if (*(char *)((long)&uStack_50 + uVar7 + 7) != '\n') {
        uVar5 = local_38->pos + uVar7;
        if (uVar5 == 0x4c) {
          uStack_50 = 0x4e5692;
          iVar4 = qp_lookahead_eol(local_38,local_44,n);
          if (iVar4 == 0) {
LAB_004e56a2:
            local_48 = 0xa0d3d;
            uVar7 = 3;
            n = 0;
          }
          else if (iVar4 == -1) {
            return local_40;
          }
        }
        else if (0x4c < uVar5) goto LAB_004e56a2;
      }
      bVar8 = size < uVar7;
      size = size - uVar7;
      if (bVar8) {
        if (local_40 != 0) {
          return local_40;
        }
        return 0xfffffffffffffffe;
      }
      uStack_50 = 0x4e56c7;
      memcpy(buffer,&local_48,uVar7);
      local_40 = local_40 + uVar7;
      buffer = buffer + uVar7;
      sVar6 = 0;
      if (*(char *)((long)&uStack_50 + uVar7 + 7) != '\n') {
        sVar6 = (part->encstate).pos + uVar7;
      }
      (part->encstate).pos = sVar6;
      uVar7 = n + (part->encstate).bufbeg;
      (part->encstate).bufbeg = uVar7;
    } while (uVar7 < (part->encstate).bufend);
  }
  else {
    local_40 = 0;
  }
  return local_40;
}

Assistant:

static size_t encoder_qp_read(char *buffer, size_t size, bool ateof,
                              curl_mimepart *part)
{
  struct mime_encoder_state *st = &part->encstate;
  char *ptr = buffer;
  size_t cursize = 0;
  int softlinebreak;
  char buf[4];

  /* On all platforms, input is supposed to be ASCII compatible: for this
     reason, we use hexadecimal ASCII codes in this function rather than
     character constants that can be interpreted as non-ascii on some
     platforms. Preserve ASCII encoding on output too. */
  while(st->bufbeg < st->bufend) {
    size_t len = 1;
    size_t consumed = 1;
    int i = st->buf[st->bufbeg];
    buf[0] = (char) i;
    buf[1] = aschex[(i >> 4) & 0xF];
    buf[2] = aschex[i & 0xF];

    switch(qp_class[st->buf[st->bufbeg] & 0xFF]) {
    case QP_OK:          /* Not a special character. */
      break;
    case QP_SP:          /* Space or tab. */
      /* Spacing must be escaped if followed by CRLF. */
      switch(qp_lookahead_eol(st, ateof, 1)) {
      case -1:          /* More input data needed. */
        return cursize;
      case 0:           /* No encoding needed. */
        break;
      default:          /* CRLF after space or tab. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    case QP_CR:         /* Carriage return. */
      /* If followed by a line-feed, output the CRLF pair.
         Else escape it. */
      switch(qp_lookahead_eol(st, ateof, 0)) {
      case -1:          /* Need more data. */
        return cursize;
      case 1:           /* CRLF found. */
        buf[len++] = '\x0A';    /* Append '\n'. */
        consumed = 2;
        break;
      default:          /* Not followed by LF: escape. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    default:            /* Character must be escaped. */
      buf[0] = '\x3D';    /* '=' */
      len = 3;
      break;
    }

    /* Be sure the encoded character fits within maximum line length. */
    if(buf[len - 1] != '\x0A') {    /* '\n' */
      softlinebreak = st->pos + len > MAX_ENCODED_LINE_LENGTH;
      if(!softlinebreak && st->pos + len == MAX_ENCODED_LINE_LENGTH) {
        /* We may use the current line only if end of data or followed by
           a CRLF. */
        switch(qp_lookahead_eol(st, ateof, consumed)) {
        case -1:        /* Need more data. */
          return cursize;
        case 0:         /* Not followed by a CRLF. */
          softlinebreak = 1;
          break;
        }
      }
      if(softlinebreak) {
        strcpy(buf, "\x3D\x0D\x0A");    /* "=\r\n" */
        len = 3;
        consumed = 0;
      }
    }

    /* If the output buffer would overflow, do not store. */
    if(len > size) {
      if(!cursize)
        return STOP_FILLING;
      break;
    }

    /* Append to output buffer. */
    memcpy(ptr, buf, len);
    cursize += len;
    ptr += len;
    size -= len;
    st->pos += len;
    if(buf[len - 1] == '\x0A')    /* '\n' */
      st->pos = 0;
    st->bufbeg += consumed;
  }

  return cursize;
}